

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

void __thiscall
slang::ast::ForwardingTypedefSymbol::checkType
          (ForwardingTypedefSymbol *this,ForwardTypeRestriction checkRestriction,
          Visibility checkVisibility,SourceLocation declLoc)

{
  string_view arg;
  bool bVar1;
  __optional_ne_t<slang::ast::Visibility,_slang::ast::Visibility> _Var2;
  Diagnostic *this_00;
  undefined4 in_EDX;
  SymbolKind in_ESI;
  SourceLocation in_RDI;
  string_view sVar3;
  Scope *in_stack_00000010;
  SourceLocation in_stack_00000018;
  DiagCode in_stack_00000024;
  Diagnostic *diag_1;
  Diagnostic *diag;
  Visibility *in_stack_ffffffffffffff68;
  Diagnostic *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff80;
  DiagCode noteCode;
  Diagnostic *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffe0;
  SourceLocation declLoc_00;
  
  noteCode = SUB84((ulong)in_stack_ffffffffffffff80 >> 0x20,0);
  if ((((Symbol *)((long)in_RDI + 0x40))->kind == Unknown) ||
     (((Symbol *)((long)in_RDI + 0x40))->kind == in_ESI)) {
    declLoc_00 = in_RDI;
    bVar1 = std::optional::operator_cast_to_bool((optional<slang::ast::Visibility> *)0x9f387e);
    if ((bVar1) &&
       (_Var2 = std::operator!=((optional<slang::ast::Visibility> *)in_stack_ffffffffffffff70,
                                in_stack_ffffffffffffff68), _Var2)) {
      Symbol::getParentScope((Symbol *)in_RDI);
      Scope::addDiag(in_stack_00000010,in_stack_00000024,in_stack_00000018);
      Diagnostic::addNote(in_stack_ffffffffffffff70,noteCode,in_RDI);
    }
    else if (*(char **)((long)in_RDI + 0x50) != (char *)0x0) {
      checkType((ForwardingTypedefSymbol *)CONCAT44(in_ESI,in_EDX),
                (ForwardTypeRestriction)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                (Visibility)in_stack_ffffffffffffffe0,declLoc_00);
    }
  }
  else {
    Symbol::getParentScope((Symbol *)in_RDI);
    this_00 = Scope::addDiag(in_stack_00000010,in_stack_00000024,in_stack_00000018);
    sVar3 = SemanticFacts::getTypeRestrictionText((ForwardTypeRestriction)((ulong)this_00 >> 0x20));
    arg._M_len._4_4_ = in_stack_ffffffffffffffbc;
    arg._M_len._0_4_ = in_stack_ffffffffffffffb8;
    arg._M_str = (char *)sVar3._M_len;
    Diagnostic::operator<<(in_stack_ffffffffffffffb0,arg);
    Diagnostic::addNote(this_00,noteCode,in_RDI);
  }
  return;
}

Assistant:

void ForwardingTypedefSymbol::checkType(ForwardTypeRestriction checkRestriction,
                                        Visibility checkVisibility, SourceLocation declLoc) const {
    if (typeRestriction != ForwardTypeRestriction::None && typeRestriction != checkRestriction) {
        auto& diag = getParentScope()->addDiag(diag::ForwardTypedefDoesNotMatch, location);
        diag << SemanticFacts::getTypeRestrictionText(typeRestriction);
        diag.addNote(diag::NoteDeclarationHere, declLoc);
        return;
    }

    if (visibility && visibility != checkVisibility) {
        auto& diag = getParentScope()->addDiag(diag::ForwardTypedefVisibility, location);
        diag.addNote(diag::NoteDeclarationHere, declLoc);
        return;
    }

    if (next)
        next->checkType(checkRestriction, checkVisibility, declLoc);
}